

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiScanlinePartThreading.cpp
# Opt level: O0

void anon_unknown.dwarf_1bc0bf::fillPixels<float>(Array2D<float> *ph,int width,int height)

{
  int iVar1;
  float *pfVar2;
  int in_EDX;
  int in_ESI;
  Array2D<float> *in_RDI;
  Array2D<float> *unaff_retaddr;
  int x;
  int y;
  int local_18;
  int local_14;
  
  Imf_3_4::Array2D<float>::resizeErase(unaff_retaddr,(long)in_RDI,CONCAT44(in_ESI,in_EDX));
  for (local_14 = 0; local_14 < in_EDX; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
      iVar1 = local_14 * in_ESI;
      pfVar2 = Imf_3_4::Array2D<float>::operator[](in_RDI,(long)local_14);
      pfVar2[local_18] = (float)((iVar1 + local_18) % 0x801);
    }
  }
  return;
}

Assistant:

void
fillPixels (Array2D<T>& ph, int width, int height)
{
    ph.resizeErase (height, width);
    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
        {
            //
            // We do this because half cannot store number bigger than 2048 exactly.
            //
            ph[y][x] = (y * width + x) % 2049;
        }
}